

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

void duckdb::ParseParquetFooter
               (data_ptr_t buffer,string *file_path,idx_t file_size,
               shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
               uint32_t *footer_len,bool *footer_encrypted)

{
  uint32_t uVar1;
  pointer pcVar2;
  InvalidInputException *pIVar3;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(int *)(buffer + 4) == 0x31524150) {
    *footer_encrypted = false;
    if ((encryption_config->internal).
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "File \'%s\' is not encrypted, but \'encryption_config\' was set","");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar2 = (file_path->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + file_path->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_c8,&local_48)
      ;
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (*(int *)(buffer + 4) != 0x45524150) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"No magic bytes found at end of file \'%s\'","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar2 = (file_path->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + file_path->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_c8,&local_88)
      ;
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    *footer_encrypted = true;
    if ((encryption_config->internal).
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "File \'%s\' is encrypted, but \'encryption_config\' was not set","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar2 = (file_path->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + file_path->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_c8,&local_68)
      ;
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar1 = *(uint32_t *)buffer;
  *footer_len = uVar1;
  if ((uVar1 != 0) && (uVar1 + 0xc <= file_size)) {
    return;
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"Footer length error in file \'%s\'","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (file_path->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + file_path->_M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_c8,&local_a8);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParseParquetFooter(data_ptr_t buffer, const string &file_path, idx_t file_size,
                        const shared_ptr<const ParquetEncryptionConfig> &encryption_config, uint32_t &footer_len,
                        bool &footer_encrypted) {
	if (memcmp(buffer + 4, "PAR1", 4) == 0) {
		footer_encrypted = false;
		if (encryption_config) {
			throw InvalidInputException("File '%s' is not encrypted, but 'encryption_config' was set", file_path);
		}
	} else if (memcmp(buffer + 4, "PARE", 4) == 0) {
		footer_encrypted = true;
		if (!encryption_config) {
			throw InvalidInputException("File '%s' is encrypted, but 'encryption_config' was not set", file_path);
		}
	} else {
		throw InvalidInputException("No magic bytes found at end of file '%s'", file_path);
	}

	// read four-byte footer length from just before the end magic bytes
	footer_len = Load<uint32_t>(buffer);
	if (footer_len == 0 || file_size < 12 + footer_len) {
		throw InvalidInputException("Footer length error in file '%s'", file_path);
	}
}